

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O2

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::flush_bits(packed_gamma_file3<unsigned_int,_6UL> *this)

{
  uint uVar1;
  ulong *puVar2;
  int iVar3;
  uint uVar4;
  ulong *puVar5;
  uint uVar6;
  ulong uVar7;
  byte local_41;
  packed_gamma_file3<unsigned_int,_6UL> *local_40;
  ofstream *local_38;
  
  while (uVar1 = (this->bits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
        (uVar1 & 7) != 0) {
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->bits,false);
  }
  puVar2 = (this->bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  puVar5 = (this->bits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  local_38 = &this->out;
  local_41 = 0;
  iVar3 = 0;
  uVar7 = 0;
  local_40 = this;
  while (uVar6 = (uint)uVar7, uVar6 != uVar1 || puVar5 != puVar2) {
    local_41 = local_41 | ((*puVar5 >> (uVar7 & 0x3f) & 1) != 0) << ((byte)(7 - (char)iVar3) & 0x1f)
    ;
    if (iVar3 == 7) {
      std::ostream::write((char *)local_38,(long)&local_41);
      local_41 = 0;
      local_40->actual_bitsize = local_40->actual_bitsize + 8;
    }
    iVar3 = (iVar3 + 1) % 8;
    uVar4 = uVar6 + 1;
    if (uVar6 == 0x3f) {
      uVar4 = 0;
    }
    puVar5 = puVar5 + (uVar6 == 0x3f);
    uVar7 = (ulong)uVar4;
  }
  return;
}

Assistant:

void flush_bits(){

		//add padding
		while(bits.size()%8!=0) bits.push_back(0);

		int n = bits.size();
		int i = 0;
		uint8_t x = 0;

		for(auto b : bits){

			x |= (uint8_t(b) << (7-i));

			if(i==7){ //we just pushed last bit of a Byte

				out.write((char*)&x,1);
				x = 0;

				actual_bitsize += 8;

			}

			i = (i+1)%8;

		}

	}